

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  bool bVar1;
  Tables *this_00;
  ulong uVar3;
  Symbol SVar4;
  MutexLockMaybe lock;
  MutexLockMaybe local_30;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar2;
  
  internal::MutexLockMaybe::MutexLockMaybe(&local_30,pool->mutex_);
  SVar4 = FindSymbol(this,name);
  aVar2 = SVar4.field_1;
  if (SVar4.type == NULL_SYMBOL) {
    if (pool->underlay_ != (DescriptorPool *)0x0) {
      this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                          (&pool->underlay_->tables_);
      SVar4 = FindByNameHelper(this_00,pool->underlay_,name);
      aVar2 = SVar4.field_1;
      uVar3 = (ulong)SVar4.type;
      if (SVar4.type != NULL_SYMBOL) goto LAB_001dd57a;
    }
    bVar1 = TryFindSymbolInFallbackDatabase(pool,name);
    uVar3 = 0;
    if (bVar1) {
      SVar4 = FindSymbol(this,name);
      aVar2 = SVar4.field_1;
      uVar3 = (ulong)SVar4.type;
    }
  }
  else {
    uVar3 = (ulong)SVar4.type;
  }
LAB_001dd57a:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_30);
  SVar4.field_1.descriptor = aVar2.descriptor;
  SVar4._0_8_ = uVar3;
  return SVar4;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(
    const DescriptorPool* pool, const string& name) const {
  MutexLockMaybe lock(pool->mutex_);
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result =
      pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}